

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined8 *puVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  Scene *pSVar8;
  float **ppfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  RTCFilterFunctionN p_Var14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  byte bVar25;
  int iVar26;
  int iVar27;
  undefined4 uVar28;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar29;
  long lVar30;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar36;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar37;
  ulong uVar38;
  float fVar39;
  uint uVar40;
  float fVar41;
  float fVar51;
  float fVar54;
  vint4 bi;
  uint uVar52;
  uint uVar55;
  float fVar57;
  uint uVar58;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar53;
  float fVar56;
  float fVar59;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar50;
  int iVar60;
  int iVar66;
  int iVar68;
  vint4 bi_1;
  float fVar61;
  float fVar67;
  float fVar69;
  int iVar70;
  float fVar71;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar72;
  float fVar74;
  float fVar81;
  float fVar84;
  vint4 ai;
  uint uVar73;
  uint uVar82;
  uint uVar85;
  float fVar87;
  uint uVar88;
  undefined1 auVar75 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar76;
  float fVar83;
  float fVar86;
  float fVar89;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar90;
  float fVar94;
  float fVar95;
  vint4 ai_1;
  StackItemT<embree::NodeRefPtr<4>_> SVar91;
  float fVar96;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  int iVar134;
  int iVar135;
  int iVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  vbool<4> valid;
  Scene *scene;
  undefined1 local_11e8 [16];
  undefined1 local_11c8 [16];
  Geometry *local_11b8;
  ulong local_11b0;
  undefined1 (*local_11a8) [16];
  long local_11a0;
  RTCFilterFunctionNArguments args;
  undefined8 local_1168;
  undefined8 uStack_1160;
  vfloat<4> tNear;
  float local_10f8 [4];
  float local_10e8 [4];
  float local_10d8 [4];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  float local_10a8 [4];
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  int local_1088;
  int iStack_1084;
  int iStack_1080;
  int iStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  undefined8 local_1018;
  undefined8 uStack_1010;
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  ulong uVar31;
  float fVar100;
  
  pSVar36 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar118 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar100 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar116 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar119 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar137 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar74 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar34 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar27 = (tray->tnear).field_0.i[k];
  iVar60 = (tray->tfar).field_0.i[k];
  local_11a8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_1028 = fVar118;
  fStack_1024 = fVar118;
  fStack_1020 = fVar118;
  fStack_101c = fVar118;
  local_1038 = fVar100;
  fStack_1034 = fVar100;
  fStack_1030 = fVar100;
  fStack_102c = fVar100;
  local_1048 = fVar116;
  fStack_1044 = fVar116;
  fStack_1040 = fVar116;
  fStack_103c = fVar116;
  local_1058 = fVar119;
  fStack_1054 = fVar119;
  fStack_1050 = fVar119;
  fStack_104c = fVar119;
  local_1068 = fVar137;
  fStack_1064 = fVar137;
  fStack_1060 = fVar137;
  fStack_105c = fVar137;
  local_1078 = fVar74;
  fStack_1074 = fVar74;
  fStack_1070 = fVar74;
  fStack_106c = fVar74;
  local_1088 = iVar27;
  iStack_1084 = iVar27;
  iStack_1080 = iVar27;
  iStack_107c = iVar27;
  fVar41 = fVar118;
  fVar139 = fVar118;
  fVar83 = fVar118;
  fVar53 = fVar100;
  fVar141 = fVar100;
  fVar86 = fVar100;
  fVar56 = fVar116;
  fVar143 = fVar116;
  fVar89 = fVar116;
  fVar59 = fVar119;
  fVar61 = fVar119;
  fVar67 = fVar119;
  fVar69 = fVar137;
  fVar71 = fVar137;
  fVar90 = fVar137;
  fVar94 = fVar74;
  fVar95 = fVar74;
  fVar96 = fVar74;
  iVar134 = iVar27;
  iVar135 = iVar27;
  iVar136 = iVar27;
  iVar66 = iVar60;
  iVar68 = iVar60;
  iVar70 = iVar60;
LAB_006eb2a6:
  do {
    do {
      if (pSVar36 == stack) {
        return;
      }
      pSVar29 = pSVar36 + -1;
      pSVar36 = pSVar36 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar29->dist &&
             (float)pSVar29->dist != *(float *)(ray + k * 4 + 0x80));
    pSVar29 = stack;
    pSVar37 = (StackItemT<embree::NodeRefPtr<4>_> *)(pSVar36->ptr).ptr;
    while (((ulong)pSVar37 & 8) == 0) {
      pfVar4 = (float *)((long)&pSVar37[2].ptr.ptr + uVar34);
      fVar39 = (*pfVar4 - fVar118) * fVar119;
      fVar51 = (pfVar4[1] - fVar41) * fVar59;
      fVar54 = (pfVar4[2] - fVar139) * fVar61;
      fVar57 = (pfVar4[3] - fVar83) * fVar67;
      pfVar4 = (float *)((long)&pSVar37[2].ptr.ptr + uVar33);
      fVar72 = (*pfVar4 - fVar100) * fVar137;
      fVar81 = (pfVar4[1] - fVar53) * fVar69;
      fVar84 = (pfVar4[2] - fVar141) * fVar71;
      fVar87 = (pfVar4[3] - fVar86) * fVar90;
      uVar73 = (uint)((int)fVar72 < (int)fVar39) * (int)fVar39 |
               (uint)((int)fVar72 >= (int)fVar39) * (int)fVar72;
      uVar82 = (uint)((int)fVar81 < (int)fVar51) * (int)fVar51 |
               (uint)((int)fVar81 >= (int)fVar51) * (int)fVar81;
      uVar85 = (uint)((int)fVar84 < (int)fVar54) * (int)fVar54 |
               (uint)((int)fVar84 >= (int)fVar54) * (int)fVar84;
      uVar88 = (uint)((int)fVar87 < (int)fVar57) * (int)fVar57 |
               (uint)((int)fVar87 >= (int)fVar57) * (int)fVar87;
      pfVar4 = (float *)((long)&pSVar37[2].ptr.ptr + uVar32);
      fVar39 = (*pfVar4 - fVar116) * fVar74;
      fVar51 = (pfVar4[1] - fVar56) * fVar94;
      fVar54 = (pfVar4[2] - fVar143) * fVar95;
      fVar57 = (pfVar4[3] - fVar89) * fVar96;
      uVar40 = (uint)((int)fVar39 < iVar27) * iVar27 | (uint)((int)fVar39 >= iVar27) * (int)fVar39;
      uVar52 = (uint)((int)fVar51 < iVar134) * iVar134 |
               (uint)((int)fVar51 >= iVar134) * (int)fVar51;
      uVar55 = (uint)((int)fVar54 < iVar135) * iVar135 |
               (uint)((int)fVar54 >= iVar135) * (int)fVar54;
      uVar58 = (uint)((int)fVar57 < iVar136) * iVar136 |
               (uint)((int)fVar57 >= iVar136) * (int)fVar57;
      tNear.field_0.i[0] =
           ((int)uVar40 < (int)uVar73) * uVar73 | ((int)uVar40 >= (int)uVar73) * uVar40;
      tNear.field_0.i[1] =
           ((int)uVar52 < (int)uVar82) * uVar82 | ((int)uVar52 >= (int)uVar82) * uVar52;
      tNear.field_0.i[2] =
           ((int)uVar55 < (int)uVar85) * uVar85 | ((int)uVar55 >= (int)uVar85) * uVar55;
      tNear.field_0.i[3] =
           ((int)uVar58 < (int)uVar88) * uVar88 | ((int)uVar58 >= (int)uVar88) * uVar58;
      pfVar4 = (float *)((long)&pSVar37[2].ptr.ptr + (uVar34 ^ 0x10));
      fVar39 = (*pfVar4 - fVar118) * fVar119;
      fVar51 = (pfVar4[1] - fVar41) * fVar59;
      fVar54 = (pfVar4[2] - fVar139) * fVar61;
      fVar57 = (pfVar4[3] - fVar83) * fVar67;
      pfVar4 = (float *)((long)&pSVar37[2].ptr.ptr + (uVar33 ^ 0x10));
      fVar72 = (*pfVar4 - fVar100) * fVar137;
      fVar81 = (pfVar4[1] - fVar53) * fVar69;
      fVar84 = (pfVar4[2] - fVar141) * fVar71;
      fVar87 = (pfVar4[3] - fVar86) * fVar90;
      uVar73 = (uint)((int)fVar39 < (int)fVar72) * (int)fVar39 |
               (uint)((int)fVar39 >= (int)fVar72) * (int)fVar72;
      uVar82 = (uint)((int)fVar51 < (int)fVar81) * (int)fVar51 |
               (uint)((int)fVar51 >= (int)fVar81) * (int)fVar81;
      uVar85 = (uint)((int)fVar54 < (int)fVar84) * (int)fVar54 |
               (uint)((int)fVar54 >= (int)fVar84) * (int)fVar84;
      uVar88 = (uint)((int)fVar57 < (int)fVar87) * (int)fVar57 |
               (uint)((int)fVar57 >= (int)fVar87) * (int)fVar87;
      pfVar4 = (float *)((long)&pSVar37[2].ptr.ptr + (uVar32 ^ 0x10));
      fVar39 = (*pfVar4 - fVar116) * fVar74;
      fVar51 = (pfVar4[1] - fVar56) * fVar94;
      fVar54 = (pfVar4[2] - fVar143) * fVar95;
      fVar57 = (pfVar4[3] - fVar89) * fVar96;
      uVar40 = (uint)(iVar60 < (int)fVar39) * iVar60 | (uint)(iVar60 >= (int)fVar39) * (int)fVar39;
      uVar52 = (uint)(iVar66 < (int)fVar51) * iVar66 | (uint)(iVar66 >= (int)fVar51) * (int)fVar51;
      uVar55 = (uint)(iVar68 < (int)fVar54) * iVar68 | (uint)(iVar68 >= (int)fVar54) * (int)fVar54;
      uVar58 = (uint)(iVar70 < (int)fVar57) * iVar70 | (uint)(iVar70 >= (int)fVar57) * (int)fVar57;
      auVar75._0_4_ =
           -(uint)((int)(((int)uVar73 < (int)uVar40) * uVar73 |
                        ((int)uVar73 >= (int)uVar40) * uVar40) < tNear.field_0.i[0]);
      auVar75._4_4_ =
           -(uint)((int)(((int)uVar82 < (int)uVar52) * uVar82 |
                        ((int)uVar82 >= (int)uVar52) * uVar52) < tNear.field_0.i[1]);
      auVar75._8_4_ =
           -(uint)((int)(((int)uVar85 < (int)uVar55) * uVar85 |
                        ((int)uVar85 >= (int)uVar55) * uVar55) < tNear.field_0.i[2]);
      auVar75._12_4_ =
           -(uint)((int)(((int)uVar88 < (int)uVar58) * uVar88 |
                        ((int)uVar88 >= (int)uVar58) * uVar58) < tNear.field_0.i[3]);
      iVar26 = movmskps((int)pSVar29,auVar75);
      if (iVar26 == 0xf) goto LAB_006eb2a6;
      bVar25 = (byte)iVar26 ^ 0xf;
      uVar38 = (ulong)pSVar37 & 0xfffffffffffffff0;
      lVar35 = 0;
      if (bVar25 != 0) {
        for (; (bVar25 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
        }
      }
      pSVar29 = *(StackItemT<embree::NodeRefPtr<4>_> **)(uVar38 + lVar35 * 8);
      uVar40 = bVar25 - 1 & (uint)bVar25;
      pSVar37 = pSVar29;
      if (uVar40 != 0) {
        uVar52 = tNear.field_0.i[lVar35];
        lVar35 = 0;
        if (uVar40 != 0) {
          for (; (uVar40 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
          }
        }
        pSVar37 = *(StackItemT<embree::NodeRefPtr<4>_> **)(uVar38 + lVar35 * 8);
        uVar55 = tNear.field_0.i[lVar35];
        uVar40 = uVar40 - 1 & uVar40;
        if (uVar40 == 0) {
          if (uVar52 < uVar55) {
            (pSVar36->ptr).ptr = (size_t)pSVar37;
            pSVar36->dist = uVar55;
            pSVar36 = pSVar36 + 1;
            pSVar37 = pSVar29;
          }
          else {
            (pSVar36->ptr).ptr = (size_t)pSVar29;
            pSVar36->dist = uVar52;
            pSVar29 = pSVar37;
            pSVar36 = pSVar36 + 1;
          }
        }
        else {
          auVar98._8_4_ = uVar52;
          auVar98._0_8_ = pSVar29;
          auVar98._12_4_ = 0;
          auVar103._8_4_ = uVar55;
          auVar103._0_8_ = pSVar37;
          auVar103._12_4_ = 0;
          lVar35 = 0;
          if (uVar40 != 0) {
            for (; (uVar40 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
            }
          }
          uVar7 = *(undefined8 *)(uVar38 + lVar35 * 8);
          iVar26 = tNear.field_0.i[lVar35];
          auVar107._8_4_ = iVar26;
          auVar107._0_8_ = uVar7;
          auVar107._12_4_ = 0;
          auVar104._8_4_ = -(uint)((int)uVar52 < (int)uVar55);
          uVar40 = uVar40 - 1 & uVar40;
          if (uVar40 == 0) {
            auVar104._4_4_ = auVar104._8_4_;
            auVar104._0_4_ = auVar104._8_4_;
            auVar104._12_4_ = auVar104._8_4_;
            auVar101._8_4_ = uVar55;
            auVar101._0_8_ = pSVar37;
            auVar101._12_4_ = 0;
            auVar102 = blendvps(auVar101,auVar98,auVar104);
            auVar75 = blendvps(auVar98,auVar103,auVar104);
            auVar42._8_4_ = -(uint)(auVar102._8_4_ < iVar26);
            auVar42._4_4_ = auVar42._8_4_;
            auVar42._0_4_ = auVar42._8_4_;
            auVar42._12_4_ = auVar42._8_4_;
            auVar97._8_4_ = iVar26;
            auVar97._0_8_ = uVar7;
            auVar97._12_4_ = 0;
            auVar98 = blendvps(auVar97,auVar102,auVar42);
            auVar103 = blendvps(auVar102,auVar107,auVar42);
            auVar43._8_4_ = -(uint)(auVar75._8_4_ < auVar103._8_4_);
            auVar43._4_4_ = auVar43._8_4_;
            auVar43._0_4_ = auVar43._8_4_;
            auVar43._12_4_ = auVar43._8_4_;
            SVar91 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar103,auVar75,auVar43);
            SVar76 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar75,auVar103,auVar43);
            *pSVar36 = SVar76;
            pSVar36[1] = SVar91;
            pSVar29 = auVar98._0_8_;
            pSVar36 = pSVar36 + 2;
            pSVar37 = pSVar29;
          }
          else {
            lVar35 = 0;
            if (uVar40 != 0) {
              for (; (uVar40 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
              }
            }
            auVar102._4_4_ = auVar104._8_4_;
            auVar102._0_4_ = auVar104._8_4_;
            auVar102._8_4_ = auVar104._8_4_;
            auVar102._12_4_ = auVar104._8_4_;
            auVar104 = blendvps(auVar103,auVar98,auVar102);
            auVar75 = blendvps(auVar98,auVar103,auVar102);
            auVar106._8_4_ = tNear.field_0.i[lVar35];
            auVar106._0_8_ = *(undefined8 *)(uVar38 + lVar35 * 8);
            auVar106._12_4_ = 0;
            auVar44._8_4_ = -(uint)(iVar26 < tNear.field_0.i[lVar35]);
            auVar44._4_4_ = auVar44._8_4_;
            auVar44._0_4_ = auVar44._8_4_;
            auVar44._12_4_ = auVar44._8_4_;
            auVar103 = blendvps(auVar106,auVar107,auVar44);
            auVar98 = blendvps(auVar107,auVar106,auVar44);
            auVar45._8_4_ = -(uint)(auVar75._8_4_ < auVar98._8_4_);
            auVar45._4_4_ = auVar45._8_4_;
            auVar45._0_4_ = auVar45._8_4_;
            auVar45._12_4_ = auVar45._8_4_;
            auVar107 = blendvps(auVar98,auVar75,auVar45);
            SVar76 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar75,auVar98,auVar45);
            auVar46._8_4_ = -(uint)(auVar104._8_4_ < auVar103._8_4_);
            auVar46._4_4_ = auVar46._8_4_;
            auVar46._0_4_ = auVar46._8_4_;
            auVar46._12_4_ = auVar46._8_4_;
            auVar75 = blendvps(auVar103,auVar104,auVar46);
            auVar98 = blendvps(auVar104,auVar103,auVar46);
            auVar47._8_4_ = -(uint)(auVar98._8_4_ < auVar107._8_4_);
            auVar47._4_4_ = auVar47._8_4_;
            auVar47._0_4_ = auVar47._8_4_;
            auVar47._12_4_ = auVar47._8_4_;
            SVar91 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar107,auVar98,auVar47);
            SVar105 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar98,auVar107,auVar47);
            *pSVar36 = SVar76;
            pSVar36[1] = SVar105;
            pSVar36[2] = SVar91;
            pSVar29 = auVar75._0_8_;
            pSVar36 = pSVar36 + 3;
            pSVar37 = pSVar29;
          }
        }
      }
    }
    local_11a0 = (ulong)((uint)pSVar37 & 0xf) - 8;
    uVar38 = (ulong)pSVar37 & 0xfffffffffffffff0;
    for (lVar35 = 0; lVar35 != local_11a0; lVar35 = lVar35 + 1) {
      lVar30 = lVar35 * 0x50;
      pSVar8 = context->scene;
      ppfVar9 = (pSVar8->vertices).items;
      pfVar10 = ppfVar9[*(uint *)(uVar38 + 0x30 + lVar30)];
      pfVar4 = pfVar10 + *(uint *)(uVar38 + lVar30);
      fVar137 = *pfVar4;
      fVar74 = pfVar4[1];
      fVar41 = pfVar4[2];
      pfVar4 = pfVar10 + *(uint *)(uVar38 + 0x10 + lVar30);
      pfVar10 = pfVar10 + *(uint *)(uVar38 + 0x20 + lVar30);
      pfVar11 = ppfVar9[*(uint *)(uVar38 + 0x34 + lVar30)];
      pfVar1 = pfVar11 + *(uint *)(uVar38 + 4 + lVar30);
      fVar139 = *pfVar1;
      fVar83 = pfVar1[1];
      fVar53 = pfVar1[2];
      pfVar1 = pfVar11 + *(uint *)(uVar38 + 0x14 + lVar30);
      pfVar11 = pfVar11 + *(uint *)(uVar38 + 0x24 + lVar30);
      pfVar12 = ppfVar9[*(uint *)(uVar38 + 0x38 + lVar30)];
      pfVar2 = pfVar12 + *(uint *)(uVar38 + 8 + lVar30);
      fVar141 = *pfVar2;
      fVar86 = pfVar2[1];
      fVar56 = pfVar2[2];
      pfVar2 = pfVar12 + *(uint *)(uVar38 + 0x18 + lVar30);
      pfVar12 = pfVar12 + *(uint *)(uVar38 + 0x28 + lVar30);
      pfVar13 = ppfVar9[*(uint *)(uVar38 + 0x3c + lVar30)];
      pfVar3 = pfVar13 + *(uint *)(uVar38 + 0xc + lVar30);
      fVar143 = *pfVar3;
      fVar89 = pfVar3[1];
      fVar59 = pfVar3[2];
      pfVar3 = pfVar13 + *(uint *)(uVar38 + 0x1c + lVar30);
      pfVar13 = pfVar13 + *(uint *)(uVar38 + 0x2c + lVar30);
      puVar5 = (undefined8 *)(uVar38 + 0x30 + lVar30);
      local_1018 = *puVar5;
      uStack_1010 = puVar5[1];
      puVar5 = (undefined8 *)(uVar38 + 0x40 + lVar30);
      local_1168 = *puVar5;
      uStack_1160 = puVar5[1];
      fVar109 = fVar137 - *pfVar4;
      fVar110 = fVar139 - *pfVar1;
      fVar111 = fVar141 - *pfVar2;
      fVar112 = fVar143 - *pfVar3;
      fVar117 = fVar74 - pfVar4[1];
      fVar120 = fVar83 - pfVar1[1];
      fVar122 = fVar86 - pfVar2[1];
      fVar124 = fVar89 - pfVar3[1];
      fVar126 = fVar41 - pfVar4[2];
      fVar127 = fVar53 - pfVar1[2];
      fVar128 = fVar56 - pfVar2[2];
      fVar129 = fVar59 - pfVar3[2];
      fVar61 = *pfVar10 - fVar137;
      fVar67 = *pfVar11 - fVar139;
      fVar69 = *pfVar12 - fVar141;
      fVar71 = *pfVar13 - fVar143;
      fVar72 = pfVar10[1] - fVar74;
      fVar81 = pfVar11[1] - fVar83;
      fVar84 = pfVar12[1] - fVar86;
      fVar87 = pfVar13[1] - fVar89;
      fVar39 = pfVar10[2] - fVar41;
      fVar51 = pfVar11[2] - fVar53;
      fVar54 = pfVar12[2] - fVar56;
      fVar57 = pfVar13[2] - fVar59;
      fVar90 = fVar126 * fVar72 - fVar117 * fVar39;
      fVar94 = fVar127 * fVar81 - fVar120 * fVar51;
      local_10c8._4_4_ = fVar94;
      local_10c8._0_4_ = fVar90;
      fVar95 = fVar128 * fVar84 - fVar122 * fVar54;
      fVar96 = fVar129 * fVar87 - fVar124 * fVar57;
      fVar118 = *(float *)(ray + k * 4);
      fVar100 = *(float *)(ray + k * 4 + 0x10);
      fVar116 = *(float *)(ray + k * 4 + 0x40);
      fVar119 = *(float *)(ray + k * 4 + 0x50);
      fVar137 = fVar137 - fVar118;
      fVar139 = fVar139 - fVar118;
      fVar141 = fVar141 - fVar118;
      fVar143 = fVar143 - fVar118;
      fVar74 = fVar74 - fVar100;
      fVar83 = fVar83 - fVar100;
      fVar86 = fVar86 - fVar100;
      fVar89 = fVar89 - fVar100;
      fVar130 = fVar137 * fVar119 - fVar74 * fVar116;
      fVar131 = fVar139 * fVar119 - fVar83 * fVar116;
      fVar132 = fVar141 * fVar119 - fVar86 * fVar116;
      fVar133 = fVar143 * fVar119 - fVar89 * fVar116;
      local_10b8._0_4_ = fVar109 * fVar39 - fVar126 * fVar61;
      local_10b8._4_4_ = fVar110 * fVar51 - fVar127 * fVar67;
      local_10b8._8_4_ = fVar111 * fVar54 - fVar128 * fVar69;
      local_10b8._12_4_ = fVar112 * fVar57 - fVar129 * fVar71;
      fVar118 = *(float *)(ray + k * 4 + 0x20);
      fVar100 = *(float *)(ray + k * 4 + 0x60);
      fVar41 = fVar41 - fVar118;
      fVar53 = fVar53 - fVar118;
      fVar56 = fVar56 - fVar118;
      fVar59 = fVar59 - fVar118;
      fVar138 = fVar41 * fVar116 - fVar137 * fVar100;
      fVar140 = fVar53 * fVar116 - fVar139 * fVar100;
      fVar142 = fVar56 * fVar116 - fVar141 * fVar100;
      fVar144 = fVar59 * fVar116 - fVar143 * fVar100;
      local_10a8[0] = fVar117 * fVar61 - fVar109 * fVar72;
      local_10a8[1] = fVar120 * fVar67 - fVar110 * fVar81;
      local_10a8[2] = fVar122 * fVar69 - fVar111 * fVar84;
      local_10a8[3] = fVar124 * fVar71 - fVar112 * fVar87;
      fVar118 = fVar74 * fVar100 - fVar41 * fVar119;
      fVar121 = fVar83 * fVar100 - fVar53 * fVar119;
      fVar123 = fVar86 * fVar100 - fVar56 * fVar119;
      fVar125 = fVar89 * fVar100 - fVar59 * fVar119;
      fVar113 = fVar116 * fVar90 + fVar119 * local_10b8._0_4_ + fVar100 * local_10a8[0];
      fVar114 = fVar116 * fVar94 + fVar119 * local_10b8._4_4_ + fVar100 * local_10a8[1];
      fVar115 = fVar116 * fVar95 + fVar119 * local_10b8._8_4_ + fVar100 * local_10a8[2];
      fVar116 = fVar116 * fVar96 + fVar119 * local_10b8._12_4_ + fVar100 * local_10a8[3];
      uVar40 = (uint)fVar113 & 0x80000000;
      uVar52 = (uint)fVar114 & 0x80000000;
      uVar55 = (uint)fVar115 & 0x80000000;
      uVar58 = (uint)fVar116 & 0x80000000;
      tNear.field_0.i[0] = (uint)(fVar61 * fVar118 + fVar72 * fVar138 + fVar39 * fVar130) ^ uVar40;
      tNear.field_0.i[1] = (uint)(fVar67 * fVar121 + fVar81 * fVar140 + fVar51 * fVar131) ^ uVar52;
      tNear.field_0.i[2] = (uint)(fVar69 * fVar123 + fVar84 * fVar142 + fVar54 * fVar132) ^ uVar55;
      tNear.field_0.i[3] = (uint)(fVar71 * fVar125 + fVar87 * fVar144 + fVar57 * fVar133) ^ uVar58;
      fVar119 = (float)((uint)(fVar118 * fVar109 + fVar138 * fVar117 + fVar130 * fVar126) ^ uVar40);
      fVar61 = (float)((uint)(fVar121 * fVar110 + fVar140 * fVar120 + fVar131 * fVar127) ^ uVar52);
      fVar67 = (float)((uint)(fVar123 * fVar111 + fVar142 * fVar122 + fVar132 * fVar128) ^ uVar55);
      fVar69 = (float)((uint)(fVar125 * fVar112 + fVar144 * fVar124 + fVar133 * fVar129) ^ uVar58);
      fVar118 = ABS(fVar113);
      fVar100 = ABS(fVar114);
      auVar99._0_8_ = CONCAT44(fVar114,fVar113) & 0x7fffffff7fffffff;
      auVar99._8_4_ = ABS(fVar115);
      auVar99._12_4_ = ABS(fVar116);
      bVar22 = ((0.0 <= fVar119 && 0.0 <= tNear.field_0.v[0]) && fVar113 != 0.0) &&
               tNear.field_0.v[0] + fVar119 <= fVar118;
      auVar108._0_4_ = -(uint)bVar22;
      bVar24 = ((0.0 <= fVar61 && 0.0 <= tNear.field_0.v[1]) && fVar114 != 0.0) &&
               tNear.field_0.v[1] + fVar61 <= fVar100;
      auVar108._4_4_ = -(uint)bVar24;
      bVar23 = ((0.0 <= fVar67 && 0.0 <= tNear.field_0.v[2]) && fVar115 != 0.0) &&
               tNear.field_0.v[2] + fVar67 <= auVar99._8_4_;
      auVar108._8_4_ = -(uint)bVar23;
      bVar21 = ((0.0 <= fVar69 && 0.0 <= tNear.field_0.v[3]) && fVar116 != 0.0) &&
               tNear.field_0.v[3] + fVar69 <= auVar99._12_4_;
      auVar108._12_4_ = -(uint)bVar21;
      iVar27 = movmskps((int)lVar30,auVar108);
      if (iVar27 != 0) {
        fVar137 = (float)(uVar40 ^ (uint)(fVar137 * fVar90 +
                                         fVar74 * local_10b8._0_4_ + fVar41 * local_10a8[0]));
        fVar74 = (float)(uVar52 ^ (uint)(fVar139 * fVar94 +
                                        fVar83 * local_10b8._4_4_ + fVar53 * local_10a8[1]));
        fVar41 = (float)(uVar55 ^ (uint)(fVar141 * fVar95 +
                                        fVar86 * local_10b8._8_4_ + fVar56 * local_10a8[2]));
        fVar139 = (float)(uVar58 ^ (uint)(fVar143 * fVar96 +
                                         fVar89 * local_10b8._12_4_ + fVar59 * local_10a8[3]));
        fVar116 = *(float *)(ray + k * 4 + 0x30);
        bVar15 = fVar116 * fVar118 < fVar137;
        bVar16 = fVar116 * fVar100 < fVar74;
        bVar17 = fVar116 * auVar99._8_4_ < fVar41;
        bVar18 = fVar116 * auVar99._12_4_ < fVar139;
        auVar77._4_4_ = -(uint)bVar16;
        auVar77._0_4_ = -(uint)bVar15;
        auVar77._8_4_ = -(uint)bVar17;
        auVar77._12_4_ = -(uint)bVar18;
        local_11e8._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
        local_11e8._4_4_ = 0;
        local_11e8._8_4_ = 0;
        local_11e8._12_4_ = 0;
        valid.field_0.i[0] =
             -(uint)((fVar137 <= (float)local_11e8._0_4_ * fVar118 && bVar15) && bVar22);
        valid.field_0.i[1] =
             -(uint)((fVar74 <= (float)local_11e8._0_4_ * fVar100 && bVar16) && bVar24);
        valid.field_0.i[2] =
             -(uint)((fVar41 <= (float)local_11e8._0_4_ * auVar99._8_4_ && bVar17) && bVar23);
        valid.field_0.i[3] =
             -(uint)((fVar139 <= (float)local_11e8._0_4_ * auVar99._12_4_ && bVar18) && bVar21);
        iVar27 = movmskps(iVar27,(undefined1  [16])valid.field_0);
        if (iVar27 != 0) {
          local_10c8._8_4_ = fVar95;
          local_10c8._12_4_ = fVar96;
          auVar75 = rcpps(auVar77,auVar99);
          fVar116 = auVar75._0_4_;
          fVar83 = auVar75._4_4_;
          fVar53 = auVar75._8_4_;
          fVar141 = auVar75._12_4_;
          fVar116 = (1.0 - fVar118 * fVar116) * fVar116 + fVar116;
          fVar83 = (1.0 - fVar100 * fVar83) * fVar83 + fVar83;
          fVar53 = (1.0 - auVar99._8_4_ * fVar53) * fVar53 + fVar53;
          fVar141 = (1.0 - auVar99._12_4_ * fVar141) * fVar141 + fVar141;
          fVar137 = fVar137 * fVar116;
          fVar74 = fVar74 * fVar83;
          fVar41 = fVar41 * fVar53;
          fVar139 = fVar139 * fVar141;
          local_10d8[0] = fVar137;
          local_10d8[1] = fVar74;
          local_10d8[2] = fVar41;
          local_10d8[3] = fVar139;
          local_10f8[0] = tNear.field_0.v[0] * fVar116;
          local_10f8[1] = tNear.field_0.v[1] * fVar83;
          local_10f8[2] = tNear.field_0.v[2] * fVar53;
          local_10f8[3] = tNear.field_0.v[3] * fVar141;
          local_10e8[0] = fVar116 * fVar119;
          local_10e8[1] = fVar83 * fVar61;
          local_10e8[2] = fVar53 * fVar67;
          local_10e8[3] = fVar141 * fVar69;
          auVar19._4_4_ = fVar74;
          auVar19._0_4_ = fVar137;
          auVar19._8_4_ = fVar41;
          auVar19._12_4_ = fVar139;
          auVar98 = blendvps(_DAT_01f45a30,auVar19,(undefined1  [16])valid.field_0);
          auVar92._4_4_ = auVar98._0_4_;
          auVar92._0_4_ = auVar98._4_4_;
          auVar92._8_4_ = auVar98._12_4_;
          auVar92._12_4_ = auVar98._8_4_;
          auVar75 = minps(auVar92,auVar98);
          auVar62._0_8_ = auVar75._8_8_;
          auVar62._8_4_ = auVar75._0_4_;
          auVar62._12_4_ = auVar75._4_4_;
          auVar75 = minps(auVar62,auVar75);
          uVar40 = -(uint)(auVar75._0_4_ == auVar98._0_4_);
          uVar52 = -(uint)(auVar75._4_4_ == auVar98._4_4_);
          uVar55 = -(uint)(auVar75._8_4_ == auVar98._8_4_);
          uVar58 = -(uint)(auVar75._12_4_ == auVar98._12_4_);
          auVar80._4_4_ = uVar52;
          auVar80._0_4_ = uVar40;
          auVar78._0_4_ = uVar40 & valid.field_0.i[0];
          auVar78._4_4_ = uVar52 & valid.field_0.i[1];
          auVar78._8_4_ = uVar55 & valid.field_0.i[2];
          auVar78._12_4_ = uVar58 & valid.field_0.i[3];
          iVar27 = movmskps(iVar27,auVar78);
          auVar79._8_4_ = 0xffffffff;
          auVar79._0_8_ = 0xffffffffffffffff;
          auVar79._12_4_ = 0xffffffff;
          if (iVar27 != 0) {
            auVar80._8_4_ = uVar55;
            auVar80._12_4_ = uVar58;
            auVar79 = auVar80;
          }
          auVar48._0_4_ = valid.field_0.i[0] & auVar79._0_4_;
          auVar48._4_4_ = valid.field_0.i[1] & auVar79._4_4_;
          auVar48._8_4_ = valid.field_0.i[2] & auVar79._8_4_;
          auVar48._12_4_ = valid.field_0.i[3] & auVar79._12_4_;
          uVar28 = movmskps(iVar27,auVar48);
          uVar31 = CONCAT44((int)((ulong)lVar30 >> 0x20),uVar28);
          local_11b0 = 0;
          if (uVar31 != 0) {
            for (; (uVar31 >> local_11b0 & 1) == 0; local_11b0 = local_11b0 + 1) {
            }
          }
LAB_006eb99b:
          uVar40 = *(uint *)((long)&local_1018 + local_11b0 * 4);
          uVar31 = (ulong)uVar40;
          local_11b8 = (pSVar8->geometries).items[uVar31].ptr;
          if ((local_11b8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            valid.field_0.v[local_11b0] = 0.0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (local_11b8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar118 = local_10f8[local_11b0];
              fVar100 = local_10e8[local_11b0];
              *(float *)(ray + k * 4 + 0x80) = local_10d8[local_11b0];
              *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_10c8 + local_11b0 * 4);
              *(float *)(ray + k * 4 + 0xd0) = local_10a8[local_11b0 - 4];
              *(float *)(ray + k * 4 + 0xe0) = local_10a8[local_11b0];
              *(float *)(ray + k * 4 + 0xf0) = fVar118;
              *(float *)(ray + k * 4 + 0x100) = fVar100;
              *(undefined4 *)(ray + k * 4 + 0x110) =
                   *(undefined4 *)((long)&local_1168 + local_11b0 * 4);
              *(uint *)(ray + k * 4 + 0x120) = uVar40;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              goto LAB_006eb820;
            }
            local_1098 = fVar137;
            fStack_1094 = fVar74;
            fStack_1090 = fVar41;
            fStack_108c = fVar139;
            h.u.field_0.v[0] = local_10f8[local_11b0];
            h.v.field_0.v[0] = local_10e8[local_11b0];
            uVar28 = *(undefined4 *)(local_10c8 + local_11b0 * 4);
            fVar118 = local_10a8[local_11b0 - 4];
            h.geomID.field_0.i[1] = uVar40;
            h.geomID.field_0.i[0] = uVar40;
            h.geomID.field_0.i[2] = uVar40;
            h.geomID.field_0.i[3] = uVar40;
            uVar6 = *(undefined4 *)((long)&local_1168 + local_11b0 * 4);
            h.primID.field_0.i[1] = uVar6;
            h.primID.field_0.i[0] = uVar6;
            h.primID.field_0.i[2] = uVar6;
            h.primID.field_0.i[3] = uVar6;
            h.Ng.field_0._4_4_ = uVar28;
            h.Ng.field_0._0_4_ = uVar28;
            h.Ng.field_0._8_4_ = uVar28;
            h.Ng.field_0._12_4_ = uVar28;
            h.Ng.field_0._20_4_ = (int)fVar118;
            h.Ng.field_0._16_4_ = (int)fVar118;
            h.Ng.field_0._24_4_ = (int)fVar118;
            h.Ng.field_0._28_4_ = (int)fVar118;
            fVar118 = local_10a8[local_11b0];
            h.Ng.field_0._36_4_ = (int)fVar118;
            h.Ng.field_0._32_4_ = (int)fVar118;
            h.Ng.field_0._40_4_ = (int)fVar118;
            h.Ng.field_0._44_4_ = (int)fVar118;
            h.u.field_0.v[1] = h.u.field_0.v[0];
            h.u.field_0.v[2] = h.u.field_0.v[0];
            h.u.field_0.v[3] = h.u.field_0.v[0];
            h.v.field_0.v[1] = h.v.field_0.v[0];
            h.v.field_0.v[2] = h.v.field_0.v[0];
            h.v.field_0.v[3] = h.v.field_0.v[0];
            h.instID[0].field_0.i[0] = context->user->instID[0];
            h.instID[0].field_0.i[1] = h.instID[0].field_0.i[0];
            h.instID[0].field_0.i[2] = h.instID[0].field_0.i[0];
            h.instID[0].field_0.i[3] = h.instID[0].field_0.i[0];
            h.instPrimID[0].field_0.i[0] = context->user->instPrimID[0];
            h.instPrimID[0].field_0.i[1] = h.instPrimID[0].field_0.i[0];
            h.instPrimID[0].field_0.i[2] = h.instPrimID[0].field_0.i[0];
            h.instPrimID[0].field_0.i[3] = h.instPrimID[0].field_0.i[0];
            *(float *)(ray + k * 4 + 0x80) = local_10d8[local_11b0];
            local_11c8 = *local_11a8;
            args.valid = (int *)local_11c8;
            args.geometryUserPtr = local_11b8->userPtr;
            args.context = context->user;
            args.hit = (RTCHitN *)&h;
            args.N = 4;
            args.ray = (RTCRayN *)ray;
            if (local_11b8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              (*local_11b8->intersectionFilterN)(&args);
            }
            if (local_11c8 == (undefined1  [16])0x0) {
              auVar63._8_4_ = 0xffffffff;
              auVar63._0_8_ = 0xffffffffffffffff;
              auVar63._12_4_ = 0xffffffff;
              auVar63 = auVar63 ^ _DAT_01f46b70;
            }
            else {
              p_Var14 = context->args->filter;
              if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((local_11b8->field_8).field_0x2 & 0x40) != 0))
                 )) {
                (*p_Var14)(&args);
              }
              auVar49._0_4_ = -(uint)(local_11c8._0_4_ == 0);
              auVar49._4_4_ = -(uint)(local_11c8._4_4_ == 0);
              auVar49._8_4_ = -(uint)(local_11c8._8_4_ == 0);
              auVar49._12_4_ = -(uint)(local_11c8._12_4_ == 0);
              auVar63 = auVar49 ^ _DAT_01f46b70;
              if (local_11c8 != (undefined1  [16])0x0) {
                auVar75 = blendvps(*(undefined1 (*) [16])args.hit,
                                   *(undefined1 (*) [16])(args.ray + 0xc0),auVar49);
                *(undefined1 (*) [16])(args.ray + 0xc0) = auVar75;
                auVar75 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                   *(undefined1 (*) [16])(args.ray + 0xd0),auVar49);
                *(undefined1 (*) [16])(args.ray + 0xd0) = auVar75;
                auVar75 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                   *(undefined1 (*) [16])(args.ray + 0xe0),auVar49);
                *(undefined1 (*) [16])(args.ray + 0xe0) = auVar75;
                auVar75 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                   *(undefined1 (*) [16])(args.ray + 0xf0),auVar49);
                *(undefined1 (*) [16])(args.ray + 0xf0) = auVar75;
                auVar75 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                   *(undefined1 (*) [16])(args.ray + 0x100),auVar49);
                *(undefined1 (*) [16])(args.ray + 0x100) = auVar75;
                auVar75 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                   *(undefined1 (*) [16])(args.ray + 0x110),auVar49);
                *(undefined1 (*) [16])(args.ray + 0x110) = auVar75;
                auVar75 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                   *(undefined1 (*) [16])(args.ray + 0x120),auVar49);
                *(undefined1 (*) [16])(args.ray + 0x120) = auVar75;
                auVar75 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                   *(undefined1 (*) [16])(args.ray + 0x130),auVar49);
                *(undefined1 (*) [16])(args.ray + 0x130) = auVar75;
                auVar75 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                   *(undefined1 (*) [16])(args.ray + 0x140),auVar49);
                *(undefined1 (*) [16])(args.ray + 0x140) = auVar75;
              }
            }
            if ((_DAT_01f46b40 & auVar63) == (undefined1  [16])0x0) {
              *(undefined4 *)(ray + k * 4 + 0x80) = local_11e8._0_4_;
            }
            else {
              local_11e8 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
            }
            valid.field_0.v[local_11b0] = 0.0;
            valid.field_0.i[0] = -(uint)(local_1098 <= (float)local_11e8._0_4_) & valid.field_0.i[0]
            ;
            valid.field_0.i[1] =
                 -(uint)(fStack_1094 <= (float)local_11e8._0_4_) & valid.field_0.i[1];
            valid.field_0.i[2] =
                 -(uint)(fStack_1090 <= (float)local_11e8._0_4_) & valid.field_0.i[2];
            valid.field_0.i[3] =
                 -(uint)(fStack_108c <= (float)local_11e8._0_4_) & valid.field_0.i[3];
            uVar31 = local_11b0;
            fVar137 = local_1098;
            fVar74 = fStack_1094;
            fVar41 = fStack_1090;
            fVar139 = fStack_108c;
          }
          iVar27 = movmskps((int)uVar31,(undefined1  [16])valid.field_0);
          if (iVar27 == 0) goto LAB_006eb820;
          auVar20._4_4_ = fVar74;
          auVar20._0_4_ = fVar137;
          auVar20._8_4_ = fVar41;
          auVar20._12_4_ = fVar139;
          auVar98 = blendvps(_DAT_01f45a30,auVar20,(undefined1  [16])valid.field_0);
          auVar93._4_4_ = auVar98._0_4_;
          auVar93._0_4_ = auVar98._4_4_;
          auVar93._8_4_ = auVar98._12_4_;
          auVar93._12_4_ = auVar98._8_4_;
          auVar75 = minps(auVar93,auVar98);
          auVar64._0_8_ = auVar75._8_8_;
          auVar64._8_4_ = auVar75._0_4_;
          auVar64._12_4_ = auVar75._4_4_;
          auVar75 = minps(auVar64,auVar75);
          auVar65._0_8_ =
               CONCAT44(-(uint)(auVar75._4_4_ == auVar98._4_4_) & valid.field_0._4_4_,
                        -(uint)(auVar75._0_4_ == auVar98._0_4_) & valid.field_0._0_4_);
          auVar65._8_4_ = -(uint)(auVar75._8_4_ == auVar98._8_4_) & valid.field_0._8_4_;
          auVar65._12_4_ = -(uint)(auVar75._12_4_ == auVar98._12_4_) & valid.field_0._12_4_;
          iVar27 = movmskps(iVar27,auVar65);
          aVar50 = valid.field_0;
          if (iVar27 != 0) {
            aVar50.i[2] = auVar65._8_4_;
            aVar50._0_8_ = auVar65._0_8_;
            aVar50.i[3] = auVar65._12_4_;
          }
          uVar28 = movmskps(iVar27,(undefined1  [16])aVar50);
          uVar31 = CONCAT44((int)(uVar31 >> 0x20),uVar28);
          local_11b0 = 0;
          if (uVar31 != 0) {
            for (; (uVar31 >> local_11b0 & 1) == 0; local_11b0 = local_11b0 + 1) {
            }
          }
          goto LAB_006eb99b;
        }
      }
LAB_006eb820:
      fVar118 = local_1028;
      fVar41 = fStack_1024;
      fVar139 = fStack_1020;
      fVar83 = fStack_101c;
      fVar100 = local_1038;
      fVar53 = fStack_1034;
      fVar141 = fStack_1030;
      fVar86 = fStack_102c;
      fVar116 = local_1048;
      fVar56 = fStack_1044;
      fVar143 = fStack_1040;
      fVar89 = fStack_103c;
      fVar119 = local_1058;
      fVar59 = fStack_1054;
      fVar61 = fStack_1050;
      fVar67 = fStack_104c;
      fVar137 = local_1068;
      fVar69 = fStack_1064;
      fVar71 = fStack_1060;
      fVar90 = fStack_105c;
      fVar74 = local_1078;
      fVar94 = fStack_1074;
      fVar95 = fStack_1070;
      fVar96 = fStack_106c;
      iVar27 = local_1088;
      iVar134 = iStack_1084;
      iVar135 = iStack_1080;
      iVar136 = iStack_107c;
    }
    iVar60 = *(int *)(ray + k * 4 + 0x80);
    iVar66 = iVar60;
    iVar68 = iVar60;
    iVar70 = iVar60;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }